

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void track_attack(CHAR_DATA *mob,CHAR_DATA *victim)

{
  bool bVar1;
  char *pcVar2;
  long in_RSI;
  long in_RDI;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffedd8;
  undefined8 in_stack_ffffffffffffede0;
  int sn;
  char *point;
  CHAR_DATA *in_stack_ffffffffffffede8;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  int in_stack_fffffffffffff004;
  CHAR_DATA *in_stack_fffffffffffff008;
  CHAR_DATA *in_stack_fffffffffffff010;
  
  sn = (int)((ulong)in_stack_ffffffffffffede0 >> 0x20);
  if ((((*(long *)(in_RDI + 0xa8) == *(long *)(in_RSI + 0xa8)) &&
       (bVar1 = can_see(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0), bVar1)) &&
      (*(long *)(in_RDI + 0x20) == 0)) &&
     (bVar1 = is_affected_by(in_stack_ffffffffffffede8,sn), !bVar1)) {
    if (*(long *)(*(long *)(in_RDI + 0x78) + 0x238) == 0) {
      sprintf(&stack0xffffffffffffede8,"%s, now you die!",*(undefined8 *)(in_RSI + 0xe8));
    }
    else {
      point = &stack0xffffffffffffede8;
      pcVar2 = act_msg(point,in_stack_ffffffffffffedd8);
      sprintf(point,"%s",pcVar2);
    }
    do_yell((CHAR_DATA *)buf._32_8_,(char *)buf._24_8_);
    multi_hit(in_stack_fffffffffffff010,in_stack_fffffffffffff008,in_stack_fffffffffffff004);
  }
  return;
}

Assistant:

void track_attack(CHAR_DATA *mob, CHAR_DATA *victim)
{
	char buf[MSL];
	if (mob->in_room != victim->in_room || !can_see(mob, victim) || mob->fighting || is_affected_by(mob, AFF_NOSHOW))
		return;

	if (mob->pIndexData->attack_yell)
		sprintf(buf, "%s", act_msg(mob->pIndexData->attack_yell, victim));
	else
		sprintf(buf, "%s, now you die!", victim->name);

	do_yell(mob, buf);
	multi_hit(mob, victim, TYPE_UNDEFINED);
}